

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

bool __thiscall Socket::makeKeepAlive(Socket *this,int idle,int intv,int cnt)

{
  int iVar1;
  int *__optval;
  int __optname;
  int __level;
  int local_20;
  int local_1c;
  int idle_local;
  int intv_local;
  int cnt_local;
  int keepAlive;
  
  __optval = &intv_local;
  local_20 = idle;
  local_1c = intv;
  idle_local = cnt;
  if (idle < 0) {
    intv_local = 0;
    iVar1 = this->_fd;
    __level = 1;
    __optname = 9;
  }
  else {
    intv_local = 1;
    iVar1 = setsockopt(this->_fd,1,9,__optval,4);
    if (iVar1 == -1) {
      return false;
    }
    iVar1 = setsockopt(this->_fd,6,4,&local_20,4);
    if (iVar1 == -1) {
      return false;
    }
    iVar1 = setsockopt(this->_fd,6,5,&local_1c,4);
    if (iVar1 == -1) {
      return false;
    }
    iVar1 = this->_fd;
    __optval = &idle_local;
    __level = 6;
    __optname = 6;
  }
  iVar1 = setsockopt(iVar1,__level,__optname,__optval,4);
  if (iVar1 == -1) {
    return false;
  }
  return true;
}

Assistant:

bool Socket::makeKeepAlive( int idle, int intv, int cnt )
{
    if(idle < 0)
    {
        int keepAlive = 0;
        if(setsockopt(_fd, SOL_SOCKET, SO_KEEPALIVE, (const char *)&keepAlive, sizeof(keepAlive)) == SOCKET_ERROR)
            return false;
    }
    else
    {
        int keepAlive = 1;
        if(setsockopt(_fd, SOL_SOCKET, SO_KEEPALIVE, (const char *)&keepAlive, sizeof(keepAlive)) == SOCKET_ERROR)
            return false;
#ifndef _WIN32
#ifdef SYSTEM_MACOS
        if(setsockopt(_fd, IPPROTO_TCP, TCP_KEEPALIVE, (const char *)&idle, sizeof(idle)) == SOCKET_ERROR)
            return false;
#else
        if(setsockopt(_fd, IPPROTO_TCP, TCP_KEEPIDLE, (const char *)&idle, sizeof(idle)) == SOCKET_ERROR)
            return false;
        if(setsockopt(_fd, IPPROTO_TCP, TCP_KEEPINTVL, (const char *)&intv, sizeof(intv)) == SOCKET_ERROR)
            return false;
        if(setsockopt(_fd, IPPROTO_TCP, TCP_KEEPCNT, (const char *)&cnt, sizeof(cnt)) == SOCKET_ERROR)
            return false;
#endif
#endif
    }
    return true;
}